

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

void buf_logs_write(MppBufLogs *logs,RK_U32 group_id,RK_S32 buffer_id,MppBufOps ops,RK_S32 ref_count
                   ,char *caller)

{
  MppBufLog *pMVar1;
  MppBufLog *log;
  char *caller_local;
  RK_S32 ref_count_local;
  MppBufOps ops_local;
  RK_S32 buffer_id_local;
  RK_U32 group_id_local;
  MppBufLogs *logs_local;
  
  pthread_mutex_lock((pthread_mutex_t *)logs);
  pMVar1 = logs->logs + logs->log_write;
  pMVar1->group_id = group_id;
  pMVar1->buffer_id = buffer_id;
  pMVar1->ops = ops;
  pMVar1->ref_count = ref_count;
  pMVar1->caller = caller;
  logs->log_write = logs->log_write + 1;
  if (logs->max_count <= logs->log_write) {
    logs->log_write = 0;
  }
  if (logs->log_count < logs->max_count) {
    logs->log_count = logs->log_count + 1;
  }
  else {
    logs->log_read = logs->log_read + 1;
    if (logs->max_count <= logs->log_read) {
      logs->log_read = 0;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)logs);
  return;
}

Assistant:

static void buf_logs_write(MppBufLogs *logs, RK_U32 group_id, RK_S32 buffer_id,
                           MppBufOps ops, RK_S32 ref_count, const char *caller)
{
    MppBufLog *log = NULL;

    pthread_mutex_lock(&logs->lock);

    log = &logs->logs[logs->log_write];
    log->group_id   = group_id;
    log->buffer_id  = buffer_id;
    log->ops        = ops;
    log->ref_count  = ref_count;
    log->caller     = caller;

    logs->log_write++;
    if (logs->log_write >= logs->max_count)
        logs->log_write = 0;

    if (logs->log_count < logs->max_count)
        logs->log_count++;
    else {
        logs->log_read++;
        if (logs->log_read >= logs->max_count)
            logs->log_read = 0;
    }

    pthread_mutex_unlock(&logs->lock);
}